

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

void __thiscall Minisat::SimpSolver::removeClause(SimpSolver *this,CRef cr)

{
  uint64_t *puVar1;
  int *piVar2;
  char *pcVar3;
  undefined8 in_RAX;
  ulong *puVar4;
  int iVar5;
  ulong uVar6;
  undefined8 uStack_38;
  
  puVar4 = (ulong *)((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory + cr);
  puVar1 = &(this->super_Solver).statistics.simpSteps;
  *puVar1 = *puVar1 + 1;
  uStack_38 = in_RAX;
  if ((this->use_simplification == true) && (*puVar4 >> 0x22 != 0)) {
    uVar6 = 0;
    do {
      piVar2 = (this->n_occ).data + *(int *)((long)puVar4 + uVar6 * 4 + 8);
      *piVar2 = *piVar2 + -1;
      iVar5 = *(int *)((long)puVar4 + uVar6 * 4 + 8) >> 1;
      if (((iVar5 < (this->elim_heap).indices.sz) && (-1 < (this->elim_heap).indices.data[iVar5]))
         || (((this->frozen).data[iVar5] == '\0' &&
             (((this->eliminated).data[iVar5] == '\0' &&
              (((this->super_Solver).assigns.data[iVar5].value & 2) != 0)))))) {
        Heap<Minisat::SimpSolver::ElimLt>::update(&this->elim_heap,iVar5);
      }
      iVar5 = *(int *)((long)puVar4 + uVar6 * 4 + 8) >> 1;
      uStack_38 = CONCAT44(iVar5,(undefined4)uStack_38);
      pcVar3 = (this->occurs).dirty.data;
      if (pcVar3[iVar5] == '\0') {
        pcVar3[iVar5] = '\x01';
        vec<int>::push(&(this->occurs).dirties,(int *)((long)&uStack_38 + 4));
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < *puVar4 >> 0x22);
  }
  Solver::removeClause(&this->super_Solver,cr,true);
  return;
}

Assistant:

void SimpSolver::removeClause(CRef cr)
{
    const Clause &c = ca[cr];
    statistics.simpSteps++;

    if (use_simplification)
        for (int i = 0; i < c.size(); i++) {
            n_occ[toInt(c[i])]--;
            updateElimHeap(var(c[i]));
            occurs.smudge(var(c[i]));
        }

    Solver::removeClause(cr);
}